

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

void __thiscall
lzham::lzcompressor::coding_stats::update
          (coding_stats *this,lzdecision *lzdec,state *cur_state,search_accelerator *dict,
          bit_cost_t cost)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  uchar *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  iVar4 = lzdec->m_len;
  uVar6 = iVar4 + (uint)(iVar4 == 0);
  uVar2 = this->m_total_bytes;
  uVar3 = this->m_total_contexts;
  this->m_total_bytes = uVar6 + uVar2;
  this->m_total_contexts = uVar3 + 1;
  dVar15 = (double)((float)cost * 5.9604645e-08);
  this->m_total_cost = this->m_total_cost + dVar15;
  if ((int)(lzdec->m_pos - cur_state->m_block_start_dict_ofs) < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = (uint)((dict->m_dict).m_p[lzdec->m_pos - 1] >> 2);
  }
  uVar10 = (cur_state->super_state_base).m_cur_state;
  uVar9 = uVar10 << 6 | uVar9;
  if (iVar4 == 0) {
    dVar13 = (double)*(uint *)(gProbCost +
                              (ulong)*(ushort *)
                                      ((long)(&cur_state->super_state_base + 1) +
                                      (ulong)uVar9 * 2 + 4) * 4);
    this->m_total_is_match0_bits_cost = this->m_total_is_match0_bits_cost + dVar13;
    this->m_total_match_bits_cost = this->m_total_match_bits_cost + dVar13;
    dVar14 = this->m_worst_match_bits_cost;
    if (this->m_worst_match_bits_cost <= dVar13) {
      dVar14 = dVar13;
    }
    this->m_worst_match_bits_cost = dVar14;
    this->m_total_nonmatches = this->m_total_nonmatches + 1;
    if (uVar10 < 7) {
      this->m_total_lits = this->m_total_lits + 1;
      this->m_total_lit_cost = this->m_total_lit_cost + dVar15;
      dVar14 = this->m_worst_lit_cost;
      if (this->m_worst_lit_cost <= dVar15) {
        dVar14 = dVar15;
      }
      this->m_worst_lit_cost = dVar14;
      return;
    }
    this->m_total_delta_lits = this->m_total_delta_lits + 1;
    this->m_total_delta_lit_cost = this->m_total_delta_lit_cost + dVar15;
    dVar14 = this->m_worst_delta_lit_cost;
    if (this->m_worst_delta_lit_cost <= dVar15) {
      dVar14 = dVar15;
    }
    this->m_worst_delta_lit_cost = dVar14;
    return;
  }
  uVar11 = 0;
  uVar10 = 0;
  if ((0 < iVar4) && (uVar10 = lzdec->m_dist, (int)uVar10 < 0)) {
    uVar10 = (cur_state->super_state_base).m_match_hist[~uVar10];
  }
  if ((int)uVar10 <= (int)dict->m_cur_dict_size) {
    puVar5 = (dict->m_dict).m_p;
    for (lVar12 = 0; lVar12 != 0x101; lVar12 = lVar12 + 1) {
      if (puVar5[lVar12 + (ulong)(dict->m_lookahead_pos - uVar10 & dict->m_max_dict_size_mask)] !=
          puVar5[lVar12 + (ulong)(dict->m_max_dict_size_mask & dict->m_lookahead_pos)])
      goto LAB_0010c578;
    }
    lVar12 = 0x101;
LAB_0010c578:
    uVar11 = (uint)lVar12;
    if (uVar6 <= uVar11) goto LAB_0010c5ab;
  }
  lzham_assert("lzdec.get_len() <= actual_match_len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_lzcomp_internal.cpp"
               ,0x432);
  uVar6 = lzdec->m_len + (uint)(lzdec->m_len == 0);
LAB_0010c5ab:
  this->m_total_truncated_matches =
       this->m_total_truncated_matches + (uint)(uVar6 <= uVar11 && uVar11 - uVar6 != 0);
  this->m_match_truncation_len_hist[uVar11 - uVar6] =
       this->m_match_truncation_len_hist[uVar11 - uVar6] + 1;
  iVar4 = lzdec->m_len;
  uVar8 = (ulong)(uint)~lzdec->m_dist;
  uVar7 = 4;
  if (lzdec->m_dist < 1) {
    uVar7 = uVar8;
  }
  if (iVar4 < 1) {
    uVar7 = uVar8;
  }
  uVar6 = iVar4 + (uint)(iVar4 == 0);
  lVar12 = 0x934;
  if (uVar6 < uVar11) {
    this->m_match_truncation_hist[uVar6] = this->m_match_truncation_hist[uVar6] + 1;
    lVar12 = 0x844;
  }
  piVar1 = (int *)((long)this->m_match_truncation_len_hist +
                  uVar7 * 4 + (ulong)(cur_state->super_state_base).m_cur_state * 0x14 + lVar12 +
                  -0x34);
  *piVar1 = *piVar1 + 1;
  dVar13 = (double)*(uint *)(gProbCost +
                            (ulong)(0x800 - *(ushort *)
                                             ((long)(&cur_state->super_state_base + 1) +
                                             (ulong)uVar9 * 2 + 4)) * 4);
  this->m_total_is_match1_bits_cost = this->m_total_is_match1_bits_cost + dVar13;
  this->m_total_match_bits_cost = this->m_total_match_bits_cost + dVar13;
  dVar14 = this->m_worst_match_bits_cost;
  if (this->m_worst_match_bits_cost <= dVar13) {
    dVar14 = dVar13;
  }
  this->m_worst_match_bits_cost = dVar14;
  this->m_total_matches = this->m_total_matches + 1;
  uVar6 = lzdec->m_dist;
  if ((int)uVar6 < 0) {
    this->m_total_reps = this->m_total_reps + 1;
    this->m_total_is_rep0 = this->m_total_is_rep0 + 1;
    if (uVar6 == 0xffffffff) {
      this->m_total_is_rep0_len1 = this->m_total_is_rep0_len1 + 1;
      if (lzdec->m_len == 1) {
        this->m_total_rep0_len1_matches = this->m_total_rep0_len1_matches + 1;
        this->m_total_rep0_len1_cost = this->m_total_rep0_len1_cost + dVar15;
        dVar14 = this->m_worst_rep0_len1_cost;
        if (this->m_worst_rep0_len1_cost <= dVar15) {
          dVar14 = dVar15;
        }
        this->m_worst_rep0_len1_cost = dVar14;
      }
      else {
        this->m_total_rep_matches[0] = this->m_total_rep_matches[0] + 1;
        this->m_total_rep_cost[0] = this->m_total_rep_cost[0] + dVar15;
        dVar14 = this->m_worst_rep_cost[0];
        if (this->m_worst_rep_cost[0] <= dVar15) {
          dVar14 = dVar15;
        }
        this->m_worst_rep_cost[0] = dVar14;
      }
    }
    else {
      this->m_total_is_rep1 = this->m_total_is_rep1 + 1;
      uVar9 = ~uVar6;
      if (uVar6 != 0xfffffffe) {
        this->m_total_is_rep2 = this->m_total_is_rep2 + 1;
      }
      this->m_total_rep_matches[uVar9] = this->m_total_rep_matches[uVar9] + 1;
      this->m_total_rep_cost[uVar9] = this->m_total_rep_cost[uVar9] + dVar15;
      dVar14 = this->m_worst_rep_cost[uVar9];
      if (this->m_worst_rep_cost[uVar9] <= dVar15) {
        dVar14 = dVar15;
      }
      this->m_worst_rep_cost[uVar9] = dVar14;
    }
  }
  else {
    this->m_total_full_matches[lzdec->m_len + (uint)(lzdec->m_len == 0)] =
         this->m_total_full_matches[lzdec->m_len + (uint)(lzdec->m_len == 0)] + 1;
    uVar6 = lzdec->m_len;
    uVar7 = 1;
    if (1 < uVar6) {
      uVar7 = (ulong)uVar6;
    }
    this->m_total_full_match_cost[uVar7] = this->m_total_full_match_cost[uVar7] + dVar15;
    dVar14 = this->m_worst_full_match_cost[uVar7];
    if (this->m_worst_full_match_cost[uVar7] <= dVar15) {
      dVar14 = dVar15;
    }
    this->m_worst_full_match_cost[uVar7] = dVar14;
    if (uVar6 == 2) {
      if (lzdec->m_dist < 0x201) {
        this->m_total_near_len2_matches = this->m_total_near_len2_matches + 1;
      }
      else {
        this->m_total_far_len2_matches = this->m_total_far_len2_matches + 1;
      }
    }
  }
  return;
}

Assistant:

void lzcompressor::coding_stats::update(const lzdecision& lzdec, const state& cur_state, const search_accelerator& dict, bit_cost_t cost)
   {
      m_total_bytes += lzdec.get_len();
      m_total_contexts++;

      float cost_in_bits = cost / (float)cBitCostScale;

      m_total_cost += cost_in_bits;

      uint match_pred = cur_state.get_pred_char(dict, lzdec.m_pos, 1);
      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(match_pred, cur_state.m_cur_state);

      if (lzdec.m_len == 0)
      {
         bit_cost_t match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(0);
         m_total_is_match0_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_nonmatches++;

         if (cur_state.m_cur_state < CLZBase::cNumLitStates)
         {
            m_total_lits++;
            m_total_lit_cost += cost_in_bits;
            m_worst_lit_cost = math::maximum<double>(m_worst_lit_cost, cost_in_bits);
         }
         else
         {
            m_total_delta_lits++;
            m_total_delta_lit_cost += cost_in_bits;
            m_worst_delta_lit_cost = math::maximum<double>(m_worst_delta_lit_cost, cost_in_bits);
         }
      }
      else
      {
         {
            uint match_dist = lzdec.get_match_dist(cur_state);

            uint actual_match_len = dict.get_match_len(0, match_dist, CLZBase::cMaxMatchLen);
            LZHAM_VERIFY(lzdec.get_len() <= actual_match_len);

            m_total_truncated_matches += lzdec.get_len() < actual_match_len;
            m_match_truncation_len_hist[actual_match_len - lzdec.get_len()]++;

            uint type_index = 4;
            if (!lzdec.is_full_match())
            {
               LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
               type_index = -lzdec.m_dist - 1;
            }

            if (actual_match_len > lzdec.get_len())
            {
               m_match_truncation_hist[lzdec.get_len()]++;

               m_match_type_truncation_hist[cur_state.m_cur_state][type_index]++;
            }
            else
            {
               m_match_type_was_not_truncated_hist[cur_state.m_cur_state][type_index]++;
            }
         }

         bit_cost_t match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(1);
         m_total_is_match1_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_matches++;

         if (lzdec.m_dist < 0)
         {
            m_total_reps++;
            m_total_is_rep0++;

            // rep match

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               m_total_is_rep0_len1++;

               // rep0 match
               if (lzdec.m_len == 1)
               {
                  m_total_rep0_len1_matches++;
                  m_total_rep0_len1_cost += cost_in_bits;
                  m_worst_rep0_len1_cost = math::maximum<double>(m_worst_rep0_len1_cost, cost_in_bits);
               }
               else
               {
                  m_total_rep_matches[0]++;
                  m_total_rep_cost[0] += cost_in_bits;
                  m_worst_rep_cost[0] = math::maximum<double>(m_worst_rep_cost[0], cost_in_bits);
               }
            }
            else
            {
               m_total_is_rep1++;

               if (match_hist_index > 1)
               {
                  m_total_is_rep2++;
               }

               LZHAM_ASSERT(match_hist_index < CLZBase::cMatchHistSize);
               m_total_rep_matches[match_hist_index]++;
               m_total_rep_cost[match_hist_index] += cost_in_bits;
               m_worst_rep_cost[match_hist_index] = math::maximum<double>(m_worst_rep_cost[match_hist_index], cost_in_bits);
            }
         }
         else
         {
            m_total_full_matches[lzdec.get_len()]++;
            m_total_full_match_cost[lzdec.get_len()] += cost_in_bits;
            m_worst_full_match_cost[lzdec.get_len()] = math::maximum<double>(m_worst_full_match_cost[lzdec.get_len()], cost_in_bits);

            if (lzdec.get_len() == 2)
            {
               if (lzdec.m_dist <= 512)
                  m_total_near_len2_matches++;
               else
                  m_total_far_len2_matches++;
            }
         }
      }
   }